

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

fdb_status wal_snap_insert(snap_handle *shandle,fdb_doc *doc,uint64_t offset,wal_item_action action)

{
  uint64_t *puVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  wal_item_header query_hdr;
  wal_item query;
  undefined1 auStack_e8 [24];
  void *local_d0;
  undefined2 local_c8;
  undefined1 *local_88;
  avl_node local_48;
  
  local_88 = auStack_e8;
  local_d0 = doc->key;
  local_c8 = (undefined2)doc->keylen;
  paVar3 = avl_search(&shandle->key_tree,&local_48,_snap_cmp_bykey);
  if (paVar3 == (avl_node *)0x0) {
    pvVar4 = calloc(1,0x80);
    pvVar5 = malloc(0x38);
    *(void **)((long)pvVar4 + 0x28) = pvVar5;
    *(void **)((long)pvVar5 + 0x18) = doc->key;
    *(short *)((long)pvVar5 + 0x20) = (short)doc->keylen;
    *(fdb_seqnum_t *)((long)pvVar4 + 0x58) = doc->seqnum;
    *(wal_item_action *)((long)pvVar4 + 0x48) = action;
    *(uint64_t *)((long)pvVar4 + 0x50) = offset;
    avl_insert(&shandle->key_tree,(avl_node *)((long)pvVar4 + 0x68),_snap_cmp_bykey);
    avl_insert(&shandle->seq_tree,(avl_node *)((long)pvVar4 + 0x10),_wal_cmp_byseq);
    puVar1 = &(shandle->stat).wal_ndocs;
    *puVar1 = *puVar1 + 1;
    if (doc->deleted == true) {
      puVar1 = &(shandle->stat).wal_ndeletes;
      *puVar1 = *puVar1 + 1;
    }
    *(snap_handle **)((long)pvVar4 + 0x40) = shandle;
    return FDB_RESULT_SUCCESS;
  }
  free(paVar3[-3].left[1].parent);
  paVar2 = paVar3[-3].left;
  paVar2[1].parent = (avl_node *)doc->key;
  *(short *)&paVar2[1].left = (short)doc->keylen;
  if (paVar3[-1].left != (avl_node *)doc->seqnum) {
    paVar3[-1].left = (avl_node *)doc->seqnum;
    avl_remove(&shandle->seq_tree,(avl_node *)&paVar3[-4].left);
    avl_insert(&shandle->seq_tree,(avl_node *)&paVar3[-4].left,_wal_cmp_byseq);
  }
  if (*(char *)&paVar3[-2].right == '\x01') {
    lVar6 = -1;
    if (doc->deleted != false) goto LAB_001431de;
  }
  else if ((*(char *)&paVar3[-2].right != '\0') || (lVar6 = 1, doc->deleted == false))
  goto LAB_001431de;
  puVar1 = &(shandle->stat).wal_ndeletes;
  *puVar1 = *puVar1 + lVar6;
LAB_001431de:
  *(bool *)&paVar3[-2].right = doc->deleted;
  paVar3[-1].parent = (avl_node *)offset;
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snap_insert(struct snap_handle *shandle,
                           fdb_doc *doc,
                           uint64_t offset,
                           wal_item_action action)
{
    struct wal_item query;
    struct wal_item_header query_hdr;
    struct wal_item *item;
    struct avl_node *node;
    query_hdr.key = doc->key;
    query_hdr.keylen = doc->keylen;
    query.header = &query_hdr;
    node = avl_search(&shandle->key_tree, &query.avl_keysnap, _snap_cmp_bykey);

    if (!node) {
        item = (struct wal_item *) calloc(1, sizeof(struct wal_item));
        item->header = (struct wal_item_header *) malloc(
                                  sizeof(struct wal_item_header));
        item->header->key = doc->key;
        item->header->keylen = doc->keylen;
        item->seqnum = doc->seqnum;
        item->action = action;
        item->offset = offset;
        avl_insert(&shandle->key_tree, &item->avl_keysnap, _snap_cmp_bykey);
        avl_insert(&shandle->seq_tree, &item->avl_seq, _wal_cmp_byseq);

        // Note: same logic in wal_commit
        shandle->stat.wal_ndocs++;
        if (doc->deleted) {
            shandle->stat.wal_ndeletes++;
        }
        item->shandle = shandle;
    } else {
        // replace existing node with new values so there are no duplicates
        item = _get_entry(node, struct wal_item, avl_keysnap);
        free(item->header->key);
        item->header->key = doc->key;
        item->header->keylen = doc->keylen;
        if (item->seqnum != doc->seqnum) { // Re-index duplicate into seqtree
            item->seqnum = doc->seqnum;
            avl_remove(&shandle->seq_tree, &item->avl_seq);
            avl_insert(&shandle->seq_tree, &item->avl_seq, _wal_cmp_byseq);
        }

        // Note: same logic in wal_commit
        if (item->action == WAL_ACT_INSERT &&
            doc->deleted) {
            shandle->stat.wal_ndeletes++;
        } else if (item->action == WAL_ACT_LOGICAL_REMOVE &&
                   !doc->deleted) {
            shandle->stat.wal_ndeletes--;
        }

        item->action = doc->deleted ? WAL_ACT_LOGICAL_REMOVE : WAL_ACT_INSERT;
        item->offset = offset;
    }
    return FDB_RESULT_SUCCESS;
}